

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddecoder.c
# Opt level: O0

int initSoundDecoder(Sound_Channels _channels,Sound_Driver _driver,char *file,char *_alsaDevice)

{
  int iVar1;
  char *local_250;
  int extra_1;
  int extra;
  char soundFile [513];
  char *_alsaDevice_local;
  char *file_local;
  Sound_Driver _driver_local;
  Sound_Channels _channels_local;
  
  channels = 2 - (uint)(_channels == SOUND_CHANNELS_MONO);
  errorSoundDecoder[0] = '\0';
  sound_channels = _channels;
  driver = _driver;
  if (_driver == DRIVER_ALSA) {
    local_250 = _alsaDevice;
    if (_alsaDevice == (char *)0x0) {
      local_250 = "default";
    }
    iVar1 = snd_pcm_open(&pcm,local_250,1,0);
    if (iVar1 < 0) {
      strcpy(errorSoundDecoder,"Can\'t open default capture device");
      return 0;
    }
    iVar1 = input_initialize(pcm,&buffer,&buffer_l,channels,errorSoundDecoder);
    if (iVar1 < 0) {
      return 0;
    }
  }
  else if (_driver == DRIVER_PULSE) {
    pa_dev = pulseaudio_initialize((uchar)channels,(char *)0x0);
    if (pa_dev == (pa_simple *)0x0) {
      pa_dev = (pa_simple *)0x0;
      strcpy(errorSoundDecoder,"Can\'t initialize pulse audio");
      return 0;
    }
    buffer_l = 0x3fc;
    buffer = (short *)hmalloc((long)channels * 0x7f8);
  }
  else if (_driver == DRIVER_FILE) {
    strncpy((char *)&extra_1,file,0x200);
    soundFile[0x1f8] = '\0';
    fp = (FILE *)fopen((char *)&extra_1,"rb");
    if ((FILE *)fp == (FILE *)0x0) {
      strcpy(errorSoundDecoder,"Can\'t open raw file for read");
      return 0;
    }
    buffer_l = 0x3fc;
    buffer = (short *)hmalloc((long)channels * 0x7f8);
  }
  if (sound_channels == SOUND_CHANNELS_MONO) {
    rx_a = init_receiver('A',1,0);
  }
  else {
    rx_a = init_receiver('A',2,0);
    rx_b = init_receiver('B',2,1);
  }
  return 1;
}

Assistant:

int initSoundDecoder(const Sound_Channels _channels, const Sound_Driver _driver, const char *file, unsigned int deviceId) {
#endif
    sound_channels = _channels;
    driver = _driver;
    channels = sound_channels == SOUND_CHANNELS_MONO ? 1 : 2;
    errorSoundDecoder[0]=0;
    char soundFile[MAX_FILENAME_SIZE+1];
    switch (driver) {
    case DRIVER_FILE:
        strncpy(soundFile, file, MAX_FILENAME_SIZE);
        soundFile[MAX_FILENAME_SIZE]=0;
        fp = fopen(soundFile, "rb");
        if (fp) {
            buffer_l = 1024;
            int extra = buffer_l % 5;
            buffer_l -= extra;
            buffer = (short *) hmalloc(buffer_l * sizeof(short) * channels);
        } else {
            strcpy(errorSoundDecoder, "Can't open raw file for read");
            return 0;
        }
        break;
#ifdef HAVE_PULSEAUDIO
    case DRIVER_PULSE:
        if((pa_dev = pulseaudio_initialize(channels, NULL)) == NULL){
            pa_dev=NULL;
            strcpy(errorSoundDecoder, "Can't initialize pulse audio");
            return 0;
        } else {
            buffer_l = 1024;
            int extra = buffer_l % 5;
            buffer_l -= extra;
            buffer = (short *) hmalloc(buffer_l * sizeof(short) * channels);
        }
        break;
#endif
#ifdef HAVE_ALSA
    case DRIVER_ALSA:
        if (snd_pcm_open(&pcm, (_alsaDevice != NULL ? _alsaDevice : "default"), SND_PCM_STREAM_CAPTURE, 0) < 0 ) {
            strcpy(errorSoundDecoder, "Can't open default capture device");
            return 0;
        } else {
            if (input_initialize(pcm, &buffer, &buffer_l, channels, errorSoundDecoder) < 0) return 0;
        }
        break;
#endif
#ifdef WIN32
    case DRIVER_WINMM:
        buffer_l = 4096;
        int buffer_len_in_bytes = buffer_l * sizeof(short) * channels;
        buffer = (short *) hmalloc(buffer_len_in_bytes);
        if (!winmm_init(deviceId, &winmm_device, channels, buffer_len_in_bytes, &winmm_event)) {
            strcpy(errorSoundDecoder, "Can't initialize windows audio");
            return 0;
        }
        break;
#endif
    }

    if (sound_channels == SOUND_CHANNELS_MONO) {
        rx_a = init_receiver('A', 1, 0);
    } else {
        rx_a = init_receiver('A', 2, 0);
        rx_b = init_receiver('B', 2, 1);
    }
    return 1;
}